

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

void XXH3_digest_long(XXH64_hash_t *acc,XXH3_state_t *state,uchar *secret)

{
  size_t sVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  XXH64_hash_t XVar4;
  XXH64_hash_t XVar5;
  XXH64_hash_t XVar6;
  XXH64_hash_t XVar7;
  XXH64_hash_t XVar8;
  uchar *input;
  ulong __n;
  size_t __n_00;
  XXH3_f_accumulate_512 in_stack_ffffffffffffff80;
  size_t nbStripesSoFar;
  undefined1 auStack_38 [8];
  
  XVar2 = state->acc[0];
  XVar3 = state->acc[1];
  XVar4 = state->acc[2];
  XVar5 = state->acc[3];
  XVar6 = state->acc[4];
  XVar7 = state->acc[5];
  XVar8 = state->acc[7];
  acc[6] = state->acc[6];
  acc[7] = XVar8;
  acc[4] = XVar6;
  acc[5] = XVar7;
  acc[2] = XVar4;
  acc[3] = XVar5;
  *acc = XVar2;
  acc[1] = XVar3;
  __n = (ulong)state->bufferedSize;
  if (__n < 0x40) {
    __n_00 = -__n + 0x40;
    memcpy(&nbStripesSoFar,(void *)((long)state + (0x200 - __n_00)),__n_00);
    memcpy(auStack_38 + -__n,state->buffer,__n);
    sVar1 = state->secretLimit;
    input = (uchar *)&nbStripesSoFar;
  }
  else {
    nbStripesSoFar = state->nbStripesSoFar;
    XXH3_consumeStripes(acc,&nbStripesSoFar,state->nbStripesPerBlock,state->buffer,
                        (ulong)(state->bufferedSize - 1 >> 6),secret,state->secretLimit,
                        in_stack_ffffffffffffff80,(XXH3_f_scrambleAcc)nbStripesSoFar);
    input = state->customSecret + (ulong)state->bufferedSize + 0x80;
    sVar1 = state->secretLimit;
  }
  XXH3_accumulate_512_sse2(acc,input,secret + (sVar1 - 7));
  return;
}

Assistant:

XXH_FORCE_INLINE void XXH3_digest_long(XXH64_hash_t* acc,
                                       const XXH3_state_t* state,
                                       const unsigned char* secret) {
  /*
   * Digest on a local copy. This way, the state remains unaltered, and it can
   * continue ingesting more input afterwards.
   */
  memcpy(acc, state->acc, sizeof(state->acc));
  if (state->bufferedSize >= XXH_STRIPE_LEN) {
    size_t const nbStripes = (state->bufferedSize - 1) / XXH_STRIPE_LEN;
    size_t nbStripesSoFar = state->nbStripesSoFar;
    XXH3_consumeStripes(acc, &nbStripesSoFar, state->nbStripesPerBlock,
                        state->buffer, nbStripes, secret, state->secretLimit,
                        XXH3_accumulate_512, XXH3_scrambleAcc);
    /* last stripe */
    XXH3_accumulate_512(acc,
                        state->buffer + state->bufferedSize - XXH_STRIPE_LEN,
                        secret + state->secretLimit - XXH_SECRET_LASTACC_START);
  } else { /* bufferedSize < XXH_STRIPE_LEN */
    xxh_u8 lastStripe[XXH_STRIPE_LEN];
    size_t const catchupSize = XXH_STRIPE_LEN - state->bufferedSize;
    XXH_ASSERT(state->bufferedSize >
               0); /* there is always some input buffered */
    memcpy(lastStripe, state->buffer + sizeof(state->buffer) - catchupSize,
           catchupSize);
    memcpy(lastStripe + catchupSize, state->buffer, state->bufferedSize);
    XXH3_accumulate_512(acc, lastStripe,
                        secret + state->secretLimit - XXH_SECRET_LASTACC_START);
  }
}